

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mock_loader_impl.c
# Opt level: O0

loader_handle
mock_loader_impl_load_from_memory(loader_impl impl,char *name,char *buffer,size_t size)

{
  undefined8 in_RSI;
  loader_impl_mock_handle handle;
  undefined8 *local_8;
  
  local_8 = (undefined8 *)malloc(8);
  if (local_8 == (undefined8 *)0x0) {
    local_8 = (undefined8 *)0x0;
  }
  else {
    log_write_impl_va("metacall",0x169,"mock_loader_impl_load_from_memory",
                      "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/loaders/mock_loader/source/mock_loader_impl.c"
                      ,0,"Mock module %s. loaded from memory",in_RSI);
    *local_8 = 0;
  }
  return local_8;
}

Assistant:

loader_handle mock_loader_impl_load_from_memory(loader_impl impl, const loader_name name, const char *buffer, size_t size)
{
	loader_impl_mock_handle handle = malloc(sizeof(struct loader_impl_mock_handle_type));

	(void)impl;
	(void)buffer;
	(void)size;

	if (handle != NULL)
	{
		log_write("metacall", LOG_LEVEL_DEBUG, "Mock module %s. loaded from memory", name);

		handle->handle_mock_data = NULL;

		return (loader_handle)handle;
	}

	return NULL;
}